

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall
Parser::ParseComputedName<false>
          (Parser *this,ParseNodePtr *ppnodeName,LPCOLESTR *ppNameHint,LPCOLESTR *ppFullNameHint,
          uint32 *pNameLength,uint32 *pShortNameOffset)

{
  Scanner_t *this_00;
  ParseNodePtr pnodeNameExpr;
  uint32 *pShortNameOffset_local;
  uint32 *pNameLength_local;
  LPCOLESTR *ppFullNameHint_local;
  LPCOLESTR *ppNameHint_local;
  ParseNodePtr *ppnodeName_local;
  Parser *this_local;
  
  this_00 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  ParseExpr<false>(this,1,(BOOL *)0x0,1,0,*ppNameHint,pNameLength,pShortNameOffset,(IdentToken *)0x0
                   ,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
  ChkCurTokNoScan(this,0x51,-0x7ff5fc11,L"",L"");
  return;
}

Assistant:

void Parser::ParseComputedName(ParseNodePtr* ppnodeName, LPCOLESTR* ppNameHint, LPCOLESTR* ppFullNameHint, uint32 *pNameLength, uint32 *pShortNameOffset)
{
    this->GetScanner()->Scan();
    ParseNodePtr pnodeNameExpr = ParseExpr<buildAST>(koplCma, nullptr, TRUE, FALSE, *ppNameHint, pNameLength, pShortNameOffset);
    if (buildAST)
    {
        *ppnodeName = CreateUniNode(knopComputedName, pnodeNameExpr, pnodeNameExpr->ichMin, pnodeNameExpr->ichLim);
    }

    if (ppFullNameHint && buildAST && CONFIG_FLAG(UseFullName))
    {
        *ppFullNameHint = FormatPropertyString(*ppNameHint, pnodeNameExpr, pNameLength, pShortNameOffset);
    }

    ChkCurTokNoScan(tkRBrack, ERRnoRbrack);
}